

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

void __thiscall
djb::microfacet::args::args(args *this,float_t ax,float_t ay,float_t cor,float_t txn,float_t tyn)

{
  float fVar1;
  float fVar2;
  
  (this->mtra).r[0].x = 1.0;
  (this->mtra).r[0].y = 0.0;
  *(undefined8 *)&(this->mtra).r[0].z = 0;
  (this->mtra).r[1].y = 1.0;
  (this->mtra).r[1].z = 0.0;
  (this->mtra).r[2].x = 0.0;
  (this->mtra).r[2].y = 0.0;
  (this->mtra).r[2].z = 1.0;
  (this->minv).r[0].x = 1.0;
  (this->minv).r[0].y = 0.0;
  *(undefined8 *)&(this->minv).r[0].z = 0;
  (this->minv).r[1].y = 1.0;
  (this->minv).r[1].z = 0.0;
  (this->minv).r[2].x = 0.0;
  (this->minv).r[2].y = 0.0;
  (this->minv).r[2].z = 1.0;
  fVar1 = 1.0 - cor * cor;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar2 = fVar1 * ay;
  (this->minv).r[0].x = ax;
  (this->minv).r[0].y = ay * cor;
  *(undefined8 *)&(this->minv).r[0].z = 0;
  (this->minv).r[1].y = fVar2;
  (this->minv).r[1].z = 0.0;
  (this->minv).r[2].x = -txn;
  (this->minv).r[2].y = -tyn;
  (this->minv).r[2].z = 1.0;
  (this->mtra).r[0].x = 1.0 / ax;
  (this->mtra).r[0].y = 0.0;
  (this->mtra).r[0].z = txn / ax;
  (this->mtra).r[1].x = -cor / (fVar1 * ax);
  (this->mtra).r[1].y = 1.0 / fVar2;
  (this->mtra).r[1].z = (ax * tyn - ay * txn * cor) / (fVar2 * ax);
  (this->mtra).r[2].x = 0.0;
  (this->mtra).r[2].y = 0.0;
  (this->mtra).r[2].z = 1.0;
  this->detm = 1.0 / (fVar2 * ax);
  return;
}

Assistant:

microfacet::args::args(
	float_t ax, float_t ay, float_t cor, float_t txn, float_t tyn
) {
	float_t ccor = sqrt(1 - sqr(cor));
	float_t tmp = ay * ccor;
	float_t mtra21 = - cor / (ax * ccor);
	float_t mtra22 = 1 / tmp;
	float_t mtra23 = (ax * tyn - ay * txn * cor) / (ax * tmp);

	minv = mat3(
		ax   , ay * cor, 0,
		0    , tmp     , 0,
		-txn, -tyn     , 1
	);
	mtra = mat3(
		1 / ax, 0     , txn / ax,
		mtra21, mtra22, mtra23,
		0     , 0     ,   1
	);
	detm = 1 / (ax * tmp);
}